

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  pointer pcVar1;
  long lVar2;
  ostream *this_00;
  char cVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if ((this->m_str)._M_string_length <= uVar5) {
      return;
    }
    pcVar1 = (this->m_str)._M_dataplus._M_p;
    cVar3 = pcVar1[uVar5];
    if (cVar3 == '\"') {
      if (this->m_forWhat != ForAttributes) {
        cVar3 = '\"';
        goto LAB_00154ad2;
      }
      pcVar4 = "&quot;";
LAB_00154a67:
      std::operator<<(os,pcVar4);
    }
    else {
      if (cVar3 == '&') {
        pcVar4 = "&amp;";
        goto LAB_00154a67;
      }
      if (cVar3 == '>') {
        if (((2 < uVar5) && (pcVar1[uVar5 - 1] == ']')) && (pcVar1[uVar5 - 2] == ']')) {
          pcVar4 = "&gt;";
          goto LAB_00154a67;
        }
        cVar3 = '>';
LAB_00154ad2:
        std::operator<<(os,cVar3);
      }
      else {
        if (cVar3 == '<') {
          pcVar4 = "&lt;";
          goto LAB_00154a67;
        }
        if (('\b' < cVar3) && (cVar3 != '\x7f' && 0x11 < (byte)(cVar3 - 0xeU))) goto LAB_00154ad2;
        this_00 = std::operator<<(os,"&#x");
        lVar2 = *(long *)this_00;
        *(uint *)(this_00 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(this_00 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(this_00 + lVar2 + 0x18) = *(uint *)(this_00 + lVar2 + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(this_00,(int)cVar3);
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << static_cast<int>( c );
                        else
                            os << c;
                }
            }
        }